

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  int iVar1;
  Extension *pEVar2;
  Nonnull<const_char_*> failure_msg;
  Descriptor *pDVar3;
  undefined4 extraout_var;
  MessageLite *pMVar4;
  Label local_3c;
  LogMessageFatal local_38;
  undefined4 extraout_var_00;
  
  pEVar2 = FindOrNull(this,descriptor->number_);
  if (pEVar2 == (Extension *)0x0) {
    return (MessageLite *)0x0;
  }
  local_38.super_LogMessage.errno_saver_.saved_errno_ = (uint)pEVar2->is_repeated * 2 + 1;
  local_3c = LABEL_OPTIONAL;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                          ((Label *)&local_38,&local_3c,
                           "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_OPTIONAL"
                          );
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_38.super_LogMessage.errno_saver_.saved_errno_ =
         *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pEVar2->type * 4);
    local_3c = 10;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                            ((CppType *)&local_38,&local_3c,
                             "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      pMVar4 = (MessageLite *)(pEVar2->field_0).int64_t_value;
      if ((pEVar2->field_0xa & 4) != 0) {
        pDVar3 = FieldDescriptor::message_type(descriptor);
        iVar1 = (*factory->_vptr_MessageFactory[2])(factory,pDVar3);
        iVar1 = (*pMVar4->_vptr_MessageLite[9])(pMVar4,CONCAT44(extraout_var,iVar1),this->arena_);
        pMVar4 = (MessageLite *)CONCAT44(extraout_var_00,iVar1);
        if ((this->arena_ == (Arena *)0x0) &&
           ((long *)(pEVar2->field_0).int64_t_value != (long *)0x0)) {
          (**(code **)(*(long *)(pEVar2->field_0).int64_t_value + 8))();
        }
      }
      Erase(this,descriptor->number_);
      return pMVar4;
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_heavy.cc"
             ,0xc3,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
}

Assistant:

MessageLite* ExtensionSet::UnsafeArenaReleaseMessage(
    const FieldDescriptor* descriptor, MessageFactory* factory) {
  Extension* extension = FindOrNull(descriptor->number());
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      ret = extension->ptr.lazymessage_value->UnsafeArenaReleaseMessage(
          *factory->GetPrototype(descriptor->message_type()), arena_);
      if (arena_ == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      ret = extension->ptr.message_value;
    }
    Erase(descriptor->number());
    return ret;
  }
}